

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastops_ut.cpp
# Opt level: O0

void UnitTestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  EFunc EVar4;
  const_iterator pbVar5;
  ostream *poVar6;
  undefined8 uVar7;
  reference puVar8;
  result_type rVar9;
  TTestExpOpts opts;
  TTestExpOpts opts_4;
  size_t i_6;
  size_t i_5;
  size_t iterIdx;
  size_t i_4;
  size_t alignment_1;
  iterator __end6;
  iterator __begin6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range6;
  size_t i_3;
  size_t alignment;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range5;
  TTestExpOpts opts_3;
  size_t i_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> alignments;
  TTestExpOpts opts_2;
  size_t i_1;
  TTestExpOpts opts_1;
  size_t i;
  ostringstream out_1;
  float out;
  float in;
  mt19937_64 rng;
  bool inplace;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<bool> *__range3;
  bool enableDenormals;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> *__range2;
  float max;
  float min;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffeed8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffeee0;
  string *in_stack_ffffffffffffeee8;
  FastOpsTestException *in_stack_ffffffffffffeef0;
  TTestExpOpts local_f98;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  ulong uStack_f40;
  size_t local_f38;
  size_t sStack_f30;
  size_t local_f28;
  ulong uStack_f20;
  TTestExpOpts local_f10;
  ulong local_ed0;
  undefined8 local_ec8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmStack_ec0;
  size_t local_eb8;
  FastOpsTestException *pFStack_eb0;
  size_t local_ea8;
  unsigned_long uStack_ea0;
  unsigned_long local_e98;
  undefined8 uStack_e90;
  FastOpsTestException *local_e88;
  ulong local_e80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e78;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmStack_e70;
  size_t local_e68;
  FastOpsTestException *pFStack_e60;
  size_t local_e58;
  unsigned_long uStack_e50;
  unsigned_long local_e48;
  ulong uStack_e40;
  FastOpsTestException *local_e30;
  unsigned_long local_e28;
  unsigned_long *local_e20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_e18;
  undefined1 *local_e10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e08;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmStack_e00;
  size_t local_df8;
  FastOpsTestException *pFStack_df0;
  size_t local_de8;
  unsigned_long uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  FastOpsTestException *local_dc0;
  unsigned_long local_db8;
  unsigned_long *local_db0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_da8;
  undefined1 *local_da0;
  TTestExpOpts local_d98;
  ulong local_d58;
  undefined1 local_d50 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d38;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmStack_d30;
  undefined8 local_d28;
  FastOpsTestException *pFStack_d20;
  undefined8 local_d18;
  size_t sStack_d10;
  size_t local_d08;
  ulong uStack_d00;
  TTestExpOpts local_cf0;
  FastOpsTestException *local_cb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_ca8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *pmStack_ca0;
  undefined8 local_c98;
  FastOpsTestException *pFStack_c90;
  undefined8 local_c88;
  size_t sStack_c80;
  size_t local_c78;
  undefined8 uStack_c70;
  TTestExpOpts local_c60;
  FastOpsTestException *local_c20;
  undefined1 local_c11;
  ostringstream local_bf0 [376];
  float local_a78;
  float local_a74;
  mt19937_64 *in_stack_fffffffffffff9c0;
  TTestExpOpts in_stack_fffffffffffff9d0;
  const_iterator local_78;
  bool local_6a [2];
  initializer_list<bool> local_68;
  initializer_list<bool> *local_58;
  byte local_49;
  const_iterator local_48;
  const_iterator local_40;
  bool local_32 [2];
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  float local_8;
  float local_4;
  
  local_4 = -150.0;
  local_8 = 150.0;
  EVar4 = TAvxTanh<false,_false>::GetType();
  if (EVar4 != Sigmoid) {
    EVar4 = TAvxTanh<false,_false>::GetType();
    if (EVar4 != Tanh) goto LAB_0014465e;
  }
  local_4 = -20.0;
  local_8 = 20.0;
LAB_0014465e:
  local_32[0] = false;
  local_32[1] = true;
  local_30._M_array = local_32;
  local_30._M_len = 2;
  local_20 = &local_30;
  local_40 = std::initializer_list<bool>::begin(local_20);
  local_48 = std::initializer_list<bool>::end((initializer_list<bool> *)in_stack_ffffffffffffeee0);
  do {
    if (local_40 == local_48) {
      return;
    }
    local_49 = *local_40 & 1;
    local_6a[0] = false;
    local_6a[1] = true;
    local_68._M_array = local_6a;
    local_68._M_len = 2;
    local_58 = &local_68;
    local_78 = std::initializer_list<bool>::begin(local_58);
    pbVar5 = std::initializer_list<bool>::end((initializer_list<bool> *)in_stack_ffffffffffffeee0);
    for (; local_78 != pbVar5; local_78 = local_78 + 1) {
      bVar1 = *local_78;
      bVar2 = (bool)(bVar1 & 1);
      if ((local_49 & 1) == 0) {
        MXCSR = MXCSR & 0xffff7fbf | 0x8040;
      }
      else {
        MXCSR = MXCSR & 0xffff7fbf;
      }
      std::
      mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
      ::mersenne_twister_engine(in_stack_ffffffffffffeee0,(result_type)in_stack_ffffffffffffeed8);
      local_a74 = 2.0;
      local_a78 = 2.0;
      TAvxTanh<false,_false>::Apply<float>
                ((float *)in_stack_ffffffffffffeee0,(size_t)in_stack_ffffffffffffeed8,
                 (float *)0x144861);
      if ((((local_a74 != 2.0) || (NAN(local_a74))) || (local_a78 != 2.0)) || (NAN(local_a78))) {
        std::__cxx11::ostringstream::ostringstream(local_bf0);
        poVar6 = std::operator<<((ostream *)local_bf0,"assertion failed ");
        poVar6 = std::operator<<(poVar6,"in == 2 && out == 2");
        poVar6 = std::operator<<(poVar6," at ");
        poVar6 = std::operator<<(poVar6,"UnitTestFunc");
        poVar6 = std::operator<<(poVar6,", ");
        poVar6 = std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/yandex[P]fastops/fastops/ut/fastops_ut.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        std::ostream::operator<<(poVar6,0x11c);
        local_c11 = 1;
        uVar7 = __cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        FastOpsTestException::FastOpsTestException
                  (in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
        local_c11 = 0;
        __cxa_throw(uVar7,&FastOpsTestException::typeinfo,
                    FastOpsTestException::~FastOpsTestException);
      }
      TAvxTanh<false,_false>::Apply<float>
                ((float *)in_stack_ffffffffffffeee0,(size_t)in_stack_ffffffffffffeed8,
                 (float *)0x144a80);
      for (local_c20 = (FastOpsTestException *)0x1; local_c20 < (FastOpsTestException *)0x1f4;
          local_c20 = (FastOpsTestException *)&local_c20->field_0x1) {
        TTestExpOpts::TTestExpOpts(&local_c60);
        local_c60.Func = TAvxTanh<false,_false>::GetType();
        EVar4 = TAvxTanh<false,_false>::GetType();
        if (EVar4 == Sigmoid) {
LAB_00144aeb:
          local_c60.Min = -3.0;
          local_c60.Max = 3.0;
        }
        else {
          EVar4 = TAvxTanh<false,_false>::GetType();
          if (EVar4 == Tanh) goto LAB_00144aeb;
        }
        local_c60.N = 2000;
        local_c60.VecSize = (size_t)local_c20;
        local_c60.PadSize = 0x32;
        local_c60.IsRandom = true;
        in_stack_ffffffffffffeed8 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(local_c60.Min,local_c60.Func);
        in_stack_ffffffffffffeee0 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)CONCAT44(local_c60._12_4_,local_c60.Max);
        uStack_c70 = CONCAT62(local_c60._58_6_,CONCAT11(bVar2,1));
        local_c78 = local_c60.OutputAlignBytes;
        local_c88 = 0x32;
        sStack_c80 = local_c60.InputAlignBytes;
        local_c98 = 2000;
        pFStack_c90 = local_c20;
        in_stack_ffffffffffffeee8 = (string *)0x7d0;
        in_stack_ffffffffffffeef0 = local_c20;
        local_ca8 = in_stack_ffffffffffffeed8;
        pmStack_ca0 = in_stack_ffffffffffffeee0;
        local_c60.Inplace = bVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                  (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
      }
      for (local_cb0 = (FastOpsTestException *)0x1; local_cb0 < (FastOpsTestException *)0x1f4;
          local_cb0 = (FastOpsTestException *)&local_cb0->field_0x1) {
        TTestExpOpts::TTestExpOpts(&local_cf0);
        local_cf0.Func = TAvxTanh<false,_false>::GetType();
        local_cf0.Min = local_4;
        local_cf0.Max = local_8;
        local_cf0.N = 2000;
        local_cf0.VecSize = (size_t)local_cb0;
        local_cf0.PadSize = 0x32;
        in_stack_ffffffffffffeed8 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(local_4,local_cf0.Func);
        in_stack_ffffffffffffeee0 =
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)CONCAT44(local_cf0._12_4_,local_8);
        uStack_d00 = CONCAT62(local_cf0._58_6_,CONCAT11(bVar1,local_cf0.IsRandom)) &
                     0xffffffffffff01ff;
        local_d08 = local_cf0.OutputAlignBytes;
        local_d18 = 0x32;
        sStack_d10 = local_cf0.InputAlignBytes;
        local_d28 = 2000;
        pFStack_d20 = local_cb0;
        in_stack_ffffffffffffeee8 = (string *)0x7d0;
        in_stack_ffffffffffffeef0 = local_cb0;
        local_d38 = in_stack_ffffffffffffeed8;
        pmStack_d30 = in_stack_ffffffffffffeee0;
        local_cf0.Inplace = bVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                  (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x144d2f);
      for (local_d58 = 1; local_d58 < 0x20; local_d58 = local_d58 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffeef0,(value_type_conflict1 *)in_stack_ffffffffffffeee8);
      }
      TTestExpOpts::TTestExpOpts(&local_d98);
      local_d98.Func = TAvxTanh<false,_false>::GetType();
      local_d98.Min = local_4;
      local_d98.Max = local_8;
      local_d98.N = 1000;
      local_d98.IsRandom = true;
      local_d98.PadSize = 0x32;
      local_da0 = local_d50;
      local_da8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_ffffffffffffeed8);
      local_db0 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (in_stack_ffffffffffffeed8);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffeee0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffeed8);
        if (!bVar3) break;
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_da8);
        local_db8 = *puVar8;
        for (local_dc0 = (FastOpsTestException *)0x1; local_dc0 < (FastOpsTestException *)0xc8;
            local_dc0 = (FastOpsTestException *)&local_dc0->field_0x1) {
          local_d98.VecSize = (size_t)local_dc0;
          local_d98.OutputAlignBytes = 0;
          local_d98.InputAlignBytes = local_db8;
          in_stack_ffffffffffffeed8 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(local_d98.Min,local_d98.Func);
          in_stack_ffffffffffffeee0 =
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)CONCAT44(local_d98._12_4_,local_d98.Max);
          uStack_dd0 = CONCAT62(local_d98._58_6_,CONCAT11(local_d98.Inplace,local_d98.IsRandom));
          local_dd8 = 0;
          local_de8 = local_d98.PadSize;
          uStack_de0 = local_db8;
          local_df8 = local_d98.N;
          pFStack_df0 = local_dc0;
          in_stack_ffffffffffffeef0 = local_dc0;
          local_e08 = in_stack_ffffffffffffeed8;
          pmStack_e00 = in_stack_ffffffffffffeee0;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                    (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_da8);
      }
      local_e10 = local_d50;
      local_e18._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_ffffffffffffeed8);
      local_e20 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            (in_stack_ffffffffffffeed8);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffeee0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_ffffffffffffeed8);
        if (!bVar3) break;
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_e18);
        local_e28 = *puVar8;
        for (local_e30 = (FastOpsTestException *)0x1; local_e30 < (FastOpsTestException *)0xc8;
            local_e30 = (FastOpsTestException *)&local_e30->field_0x1) {
          local_d98.VecSize = (size_t)local_e30;
          local_d98.OutputAlignBytes = local_e28;
          in_stack_ffffffffffffeed8 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(local_d98.Min,local_d98.Func);
          in_stack_ffffffffffffeee0 =
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)CONCAT44(local_d98._12_4_,local_d98.Max);
          uStack_e40 = CONCAT62(local_d98._58_6_,CONCAT11(bVar1,local_d98.IsRandom)) &
                       0xffffffffffff01ff;
          local_e48 = local_e28;
          local_e58 = local_d98.PadSize;
          uStack_e50 = local_d98.InputAlignBytes;
          local_e68 = local_d98.N;
          pFStack_e60 = local_e30;
          in_stack_ffffffffffffeef0 = local_e30;
          local_e78 = in_stack_ffffffffffffeed8;
          pmStack_e70 = in_stack_ffffffffffffeee0;
          local_d98.Inplace = bVar2;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                    (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_e18);
      }
      for (local_e80 = 0; local_e80 < 0x1e; local_e80 = local_e80 + 1) {
        for (local_e88 = (FastOpsTestException *)0x1; local_e88 < (FastOpsTestException *)0x64;
            local_e88 = (FastOpsTestException *)&local_e88->field_0x1) {
          local_d98.VecSize = (size_t)local_e88;
          rVar9 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()(in_stack_ffffffffffffeee0);
          local_d98.InputAlignBytes = rVar9 + 1 + (rVar9 / 0x1f) * -0x1f;
          rVar9 = std::
                  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                  ::operator()(in_stack_ffffffffffffeee0);
          local_e98 = rVar9 + 1 + (rVar9 / 0x1f) * -0x1f;
          local_ec8 = CONCAT44(local_d98.Min,local_d98.Func);
          in_stack_ffffffffffffeee0 =
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)CONCAT44(local_d98._12_4_,local_d98.Max);
          uStack_e90 = CONCAT62(local_d98._58_6_,CONCAT11(local_d98.Inplace,local_d98.IsRandom));
          local_ea8 = local_d98.PadSize;
          uStack_ea0 = local_d98.InputAlignBytes;
          local_eb8 = local_d98.N;
          pFStack_eb0 = (FastOpsTestException *)local_d98.VecSize;
          in_stack_ffffffffffffeef0 = (FastOpsTestException *)local_d98.VecSize;
          pmStack_ec0 = in_stack_ffffffffffffeee0;
          local_d98.OutputAlignBytes = local_e98;
          TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                    (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffeef0)
      ;
      for (local_ed0 = 1; local_ed0 < 200; local_ed0 = local_ed0 + 1) {
        TTestExpOpts::TTestExpOpts(&local_f10);
        local_f10.Func = TAvxTanh<false,_false>::GetType();
        local_f10.Min = local_4;
        local_f10.Max = local_8;
        local_f10.N = 10000;
        local_f10.VecSize = local_ed0;
        local_f58 = CONCAT44(local_4,local_f10.Func);
        uStack_f50 = CONCAT44(local_f10._12_4_,local_8);
        uStack_f20 = CONCAT62(local_f10._58_6_,CONCAT11(bVar1,local_f10.IsRandom)) &
                     0xffffffffffff01ff;
        local_f28 = local_f10.OutputAlignBytes;
        local_f38 = local_f10.PadSize;
        sStack_f30 = local_f10.InputAlignBytes;
        local_f48 = 10000;
        uStack_f40 = local_ed0;
        local_f10.Inplace = bVar2;
        TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                  (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
      }
      TTestExpOpts::TTestExpOpts(&local_f98);
      local_f98.Func = TAvxTanh<false,_false>::GetType();
      local_f98.Min = local_4;
      local_f98.Max = local_8;
      local_f98.N = 5000000;
      local_f98.VecSize = 0x10;
      local_f98.Inplace = bVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
      local_f98.Min = -5.0;
      local_f98.Max = 5.0;
      local_f98.Inplace = bVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
      local_f98.Min = -5e-06;
      local_f98.Max = 5e-06;
      local_f98.N = 500000;
      in_stack_ffffffffffffeed8 =
           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           CONCAT44(0xb6a7c5ac,local_f98.Func);
      in_stack_ffffffffffffeee0 =
           (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            *)CONCAT44(local_f98._12_4_,0x36a7c5ac);
      in_stack_ffffffffffffeee8 = (string *)0x7a120;
      in_stack_ffffffffffffeef0 = (FastOpsTestException *)local_f98.VecSize;
      local_f98.Inplace = bVar2;
      TestFunc<TAvxTanh<false,false>,TTanhCompare<false,false>,float>
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d0);
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void UnitTestFunc() {
    try {
        float min = -150;
        float max = 150;
        if (sizeof(T) != 4) {
            min = -1000;
            max = 1000;
        }

        if (TFunc::GetType() == EFunc::Sigmoid || TFunc::GetType() == EFunc::Tanh) {
            min = -20;
            max = 20;
        }

        for (bool enableDenormals : {false, true}) {
            for (bool inplace : {false, true}) {
                if (enableDenormals) {
                    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_OFF);
                    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_OFF);
                } else {
                    _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_ON);
                    _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_ON);
                }

                std::mt19937_64 rng(15);
                // there should be no error on zero-size input
                {
                    T in = 2;
                    T out = 2;
                    TFunc::Apply(&in, 0, &out);
                    UNIT_ASSERT(in == 2 && out == 2);

                    TFunc::Apply((float*)nullptr, 0, (float*)nullptr);
                }

                // random test (near numbers must be vastly different)
                for (size_t i = 1; i < 500; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();

                    // othewise we will almost always get 1
                    if (TFunc::GetType() == EFunc::Sigmoid || TFunc::GetType() == EFunc::Tanh) {
                        opts.Min = -3;
                        opts.Max = 3;
                    }

                    opts.N = 2000;
                    opts.VecSize = i;
                    opts.PadSize = 50;
                    opts.IsRandom = true;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // roughly test precision + if there is no memory issues
                for (size_t i = 1; i < 500; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 2000;
                    opts.VecSize = i;
                    opts.PadSize = 50;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // roughly test precision + that there is no memory issues in an unaligned case
                if (!TFunc::Aligned) {
                    std::vector<size_t> alignments;
                    for (size_t i = 1; i < 32; ++i) {
                        alignments.push_back(i);
                    }
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 1000;
                    opts.IsRandom = true;
                    opts.PadSize = 50;
                    for (size_t alignment : alignments) {
                        for (size_t i = 1; i < 200; ++i) {
                            opts.VecSize = i;
                            opts.OutputAlignBytes = 0;
                            opts.InputAlignBytes = alignment;
                            TestFunc<TFunc, TCompare, T>(rng, opts);
                        }
                    }
                    if (!TFunc::Aligned) {
                        for (size_t alignment : alignments) {
                            for (size_t i = 1; i < 200; ++i) {
                                opts.VecSize = i;
                                opts.OutputAlignBytes = alignment;
                                opts.Inplace = inplace;
                                TestFunc<TFunc, TCompare, T>(rng, opts);
                            }
                        }
                        for (size_t iterIdx = 0; iterIdx < 30; ++iterIdx) {
                            (void)(iterIdx);
                            for (size_t i = 1; i < 100; ++i) {
                                opts.VecSize = i;
                                opts.InputAlignBytes = rng() % 31 + 1;
                                opts.OutputAlignBytes = rng() % 31 + 1;
                                TestFunc<TFunc, TCompare, T>(rng, opts);
                            }
                        }
                    }
                }

                // Test precision in more detail
                for (size_t i = 1; i < 200; ++i) {
                    TTestExpOpts opts;
                    opts.Func = TFunc::GetType();
                    opts.Min = min;
                    opts.Max = max;
                    opts.N = 10000;
                    opts.VecSize = i;
                    opts.Inplace = inplace;
                    TestFunc<TFunc, TCompare, T>(rng, opts);
                }

                // Test precision in even more detail
                TTestExpOpts opts;
                opts.Func = TFunc::GetType();
                opts.Min = min;
                opts.Max = max;
                opts.N = 5000000;
                opts.VecSize = 16;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);

                opts.Min = -5;
                opts.Max = 5;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);

                // analyze behavior near zero
                opts.Min = -0.000005;
                opts.Max = 0.000005;
                opts.N = 500000;
                opts.Inplace = inplace;
                TestFunc<TFunc, TCompare, T>(rng, opts);
            }
        }
    } catch (...) {
        _MM_SET_FLUSH_ZERO_MODE(_MM_FLUSH_ZERO_OFF);
        _MM_SET_DENORMALS_ZERO_MODE(_MM_DENORMALS_ZERO_OFF);
        throw;
    }
}